

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O1

WJTL_STATUS
CreateJsonAndVerifyEx(JlDataObject *ObjectRoot,JL_OUTPUT_FLAGS OutputFlags,char *StringMatch)

{
  JL_STATUS JVar1;
  int iVar2;
  WJTL_STATUS WVar3;
  char *jsonString;
  char *local_30;
  
  local_30 = (char *)0x0;
  JVar1 = JlOutputJsonEx(ObjectRoot,OutputFlags,&local_30);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlOutputJsonEx( ObjectRoot, OutputFlags, &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"CreateJsonAndVerifyEx",0x154);
  iVar2 = strcmp(local_30,StringMatch);
  WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, StringMatch ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"CreateJsonAndVerifyEx",0x155);
  WVar3 = WJTL_STATUS_FAILED;
  if (iVar2 == 0 && JVar1 == JL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  WjTestLib_Free(local_30);
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    CreateJsonAndVerifyEx
    (
        JlDataObject const* ObjectRoot,
        JL_OUTPUT_FLAGS     OutputFlags,
        char const*         StringMatch
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    char* jsonString = NULL;

    JL_ASSERT_SUCCESS( JlOutputJsonEx( ObjectRoot, OutputFlags, &jsonString ) );
    JL_ASSERT( strcmp( jsonString, StringMatch ) == 0 );
    JlFree( jsonString );
    jsonString = NULL;
    return TestReturn;
}